

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool __thiscall
libwebm::PesOptionalHeader::Write(PesOptionalHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  bool bVar1;
  int local_48;
  int local_44;
  int i;
  int num_stuffing_bytes;
  uint8_t *byte;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  uint8_t header [9];
  int kHeaderSize;
  PacketDataBuffer *buffer_local;
  bool write_pts_local;
  PesOptionalHeader *this_local;
  
  unique0x10000416 = buffer;
  if (buffer == (PacketDataBuffer *)0x0) {
    fprintf(_stderr,"Webm2Pes: nullptr in opt header writer.\n");
  }
  else {
    header[1] = '\t';
    header[2] = '\0';
    header[3] = '\0';
    header[4] = '\0';
    memset((void *)((long)&byte + 3),0,9);
    bVar1 = PesHeaderField::Check(&this->marker);
    if ((((((bVar1) && (bVar1 = PesHeaderField::Check(&this->scrambling), bVar1)) &&
          (bVar1 = PesHeaderField::Check(&this->priority), bVar1)) &&
         ((bVar1 = PesHeaderField::Check(&this->data_alignment), bVar1 &&
          (bVar1 = PesHeaderField::Check(&this->copyright), bVar1)))) &&
        ((bVar1 = PesHeaderField::Check(&this->original), bVar1 &&
         ((bVar1 = PesHeaderField::Check(&this->has_pts), bVar1 &&
          (bVar1 = PesHeaderField::Check(&this->has_dts), bVar1)))))) &&
       ((bVar1 = PesHeaderField::Check(&this->pts), bVar1 &&
        (bVar1 = PesHeaderField::Check(&this->stuffing_byte), bVar1)))) {
      byte._3_1_ = (byte)((this->marker).bits << ((byte)(this->marker).shift & 0x3f)) |
                   (byte)((this->scrambling).bits << ((byte)(this->scrambling).shift & 0x3f)) |
                   (byte)((this->priority).bits << ((byte)(this->priority).shift & 0x3f)) |
                   (byte)((this->data_alignment).bits << ((byte)(this->data_alignment).shift & 0x3f)
                         ) | (byte)((this->copyright).bits << ((byte)(this->copyright).shift & 0x3f)
                                   ) |
                   (byte)((this->original).bits << ((byte)(this->original).shift & 0x3f));
      byte._4_1_ = 0;
      if (write_pts) {
        byte._4_1_ = (byte)((this->has_pts).bits << ((byte)(this->has_pts).shift & 0x3f));
      }
      byte._4_1_ = byte._4_1_ | (byte)((this->has_dts).bits << ((byte)(this->has_dts).shift & 0x3f))
      ;
      byte._5_1_ = (undefined1)(this->remaining_size).bits;
      _i = (undefined1 *)((long)&byte + 5);
      local_44 = ((this->pts).num_bits + 7) / 8 + 1;
      if (write_pts) {
        byte._6_1_ = (undefined1)(this->pts).bits;
        byte._7_1_ = (undefined1)((this->pts).bits >> 8);
        local_30 = (undefined1)((this->pts).bits >> 0x10);
        local_2f = (undefined1)((this->pts).bits >> 0x18);
        local_2e = (undefined1)((this->pts).bits >> 0x20);
        _i = &local_2e;
        local_44 = 1;
      }
      for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
        _i[1] = (char)(this->stuffing_byte).bits;
        _i = _i + 1;
      }
      bVar1 = CopyAndEscapeStartCodes((uint8_t *)((long)&byte + 3),9,stack0xffffffffffffffd8);
      return bVar1;
    }
    fprintf(_stderr,"Webm2Pes: Invalid PES Optional Header field.\n");
  }
  return false;
}

Assistant:

bool PesOptionalHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in opt header writer.\n");
    return false;
  }

  const int kHeaderSize = 9;
  std::uint8_t header[kHeaderSize] = {0};
  std::uint8_t* byte = header;

  if (marker.Check() != true || scrambling.Check() != true ||
      priority.Check() != true || data_alignment.Check() != true ||
      copyright.Check() != true || original.Check() != true ||
      has_pts.Check() != true || has_dts.Check() != true ||
      pts.Check() != true || stuffing_byte.Check() != true) {
    std::fprintf(stderr, "Webm2Pes: Invalid PES Optional Header field.\n");
    return false;
  }

  // TODO(tomfinegan): As noted in above, the PesHeaderFields should be an
  // array (or some data structure) that can be iterated over.

  // First byte of header, fields: marker, scrambling, priority, alignment,
  // copyright, original.
  *byte = 0;
  *byte |= marker.bits << marker.shift;
  *byte |= scrambling.bits << scrambling.shift;
  *byte |= priority.bits << priority.shift;
  *byte |= data_alignment.bits << data_alignment.shift;
  *byte |= copyright.bits << copyright.shift;
  *byte |= original.bits << original.shift;

  // Second byte of header, fields: has_pts, has_dts, unused fields.
  *++byte = 0;
  if (write_pts == true)
    *byte |= has_pts.bits << has_pts.shift;

  *byte |= has_dts.bits << has_dts.shift;

  // Third byte of header, fields: remaining size of header.
  *++byte = remaining_size.bits & 0xff;  // Field is 8 bits wide.

  int num_stuffing_bytes =
      (pts.num_bits + 7) / 8 + 1 /* always 1 stuffing byte */;
  if (write_pts == true) {
    // Write the PTS value as big endian and adjust stuffing byte count
    // accordingly.
    *++byte = pts.bits & 0xff;
    *++byte = (pts.bits >> 8) & 0xff;
    *++byte = (pts.bits >> 16) & 0xff;
    *++byte = (pts.bits >> 24) & 0xff;
    *++byte = (pts.bits >> 32) & 0xff;
    num_stuffing_bytes = 1;
  }

  // Add the stuffing byte(s).
  for (int i = 0; i < num_stuffing_bytes; ++i)
    *++byte = stuffing_byte.bits & 0xff;

  return CopyAndEscapeStartCodes(&header[0], kHeaderSize, buffer);
}